

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.c
# Opt level: O3

int uv__signal_lock(void)

{
  ssize_t sVar1;
  int *piVar2;
  char data;
  undefined1 local_11;
  
  do {
    sVar1 = read(uv__signal_lock_pipefd[0],&local_11,1);
    if (-1 < (int)sVar1) break;
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  return (int)sVar1 >> 0x1f;
}

Assistant:

static int uv__signal_lock(void) {
  int r;
  char data;

  do {
    r = read(uv__signal_lock_pipefd[0], &data, sizeof data);
  } while (r < 0 && errno == EINTR);

  return (r < 0) ? -1 : 0;
}